

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int iVar1;
  bool local_85;
  undefined1 local_80 [4];
  int ret;
  secp256k1_ge p;
  uchar *tweak32_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  p._80_8_ = tweak32;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)local_80,pubkey);
    memset(pubkey,0,0x40);
    local_85 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ec_pubkey_tweak_add_helper((secp256k1_ge *)local_80,(uchar *)p._80_8_);
      local_85 = iVar1 != 0;
    }
    ctx_local._4_4_ = (uint)local_85;
    if (ctx_local._4_4_ != 0) {
      secp256k1_pubkey_save(pubkey,(secp256k1_ge *)local_80);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    ret = ret && secp256k1_ec_pubkey_tweak_add_helper(&p, tweak32);
    if (ret) {
        secp256k1_pubkey_save(pubkey, &p);
    }

    return ret;
}